

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.h
# Opt level: O0

void __thiscall absl::lts_20250127::Cord::ChunkIterator::AdvanceBytes(ChunkIterator *this,size_t n)

{
  bool bVar1;
  size_type sVar2;
  size_t n_local;
  ChunkIterator *this_local;
  
  if (this->bytes_remaining_ < n) {
    __assert_fail("bytes_remaining_ >= n",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord.h"
                  ,0x63d,"void absl::Cord::ChunkIterator::AdvanceBytes(size_t)");
  }
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(&this->current_chunk_);
  if (n < sVar2) {
    RemoveChunkPrefix(this,n);
  }
  else if (n != 0) {
    bVar1 = cord_internal::CordRepBtreeReader::operator_cast_to_bool(&this->btree_reader_);
    if (bVar1) {
      AdvanceBytesBtree(this,n);
    }
    else {
      this->bytes_remaining_ = 0;
    }
  }
  return;
}

Assistant:

inline void Cord::ChunkIterator::AdvanceBytes(size_t n) {
  assert(bytes_remaining_ >= n);
  if (ABSL_PREDICT_TRUE(n < current_chunk_.size())) {
    RemoveChunkPrefix(n);
  } else if (n != 0) {
    if (btree_reader_) {
      AdvanceBytesBtree(n);
    } else {
      bytes_remaining_ = 0;
    }
  }
}